

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::gestureEventHandler(QGraphicsScenePrivate *this,QGestureEvent *event)

{
  QObject *pQVar1;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *pQVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> QVar6;
  QGesture *this_00;
  undefined8 uVar7;
  undefined1 *puVar8;
  bool bVar9;
  bool bVar10;
  GestureState GVar11;
  GestureType GVar12;
  QFlags<Qt::GestureFlag> QVar13;
  GestureCancelPolicy GVar14;
  QWidget *pQVar15;
  QGraphicsView *this_01;
  QPoint QVar16;
  Node<QGesture_*,_QGraphicsObject_*> *pNVar17;
  iterator iVar18;
  iterator iVar19;
  ulong uVar20;
  QHash<QGesture_*,_QGraphicsObject_*> *this_02;
  int *piVar21;
  Data *pDVar22;
  Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *pDVar23;
  Node<QGesture_*,_QHashDummyValue> *pNVar24;
  QGraphicsItem *pQVar25;
  long lVar26;
  int iVar27;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> QVar28;
  QHash<QGesture_*,_QHashDummyValue> QVar29;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar30;
  qreal *pqVar31;
  QPointF *pQVar32;
  long lVar33;
  QList<QGraphicsObject_*> *pQVar34;
  ulong uVar35;
  ulong uVar36;
  size_t sVar37;
  uint uVar38;
  int iVar39;
  ulong uVar40;
  Data *pDVar41;
  long in_FS_OFFSET;
  byte bVar42;
  QGraphicsObject **ppQVar43;
  piter it;
  QPointF QVar44;
  GestureType gestureType;
  QGraphicsObject *obj;
  QGesture *g_2;
  QGesture *g;
  QSet<QGesture_*> gestures;
  QGesture *gesture;
  QGestureEvent ev;
  QTransform toScene;
  GestureType local_1cc;
  Data *local_1c8;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> local_1c0;
  QHash<QGesture_*,_QHashDummyValue> local_1b8;
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_> local_1b0;
  QHash<QGesture_*,_QHashDummyValue> local_1a8;
  QHash<QGesture_*,_QHashDummyValue> local_1a0;
  QArrayData *local_198;
  undefined1 *puStack_190;
  undefined1 *local_188;
  QHashDummyValue local_179;
  QTransform local_178;
  QArrayDataPointer<QGraphicsObject_*> local_128 [3];
  QTransform local_d8;
  QPointF local_88 [5];
  long local_38;
  
  bVar42 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar15 = QGestureEvent::widget(event);
  if ((pQVar15 == (QWidget *)0x0) ||
     (this_01 = (QGraphicsView *)QMetaObject::cast((QObject *)&QGraphicsView::staticMetaObject),
     this_01 == (QGraphicsView *)0x0)) goto LAB_00616fda;
  local_188 = &DAT_aaaaaaaaaaaaaaaa;
  local_198 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_190 = &DAT_aaaaaaaaaaaaaaaa;
  QGestureEvent::gestures(event);
  local_1a0.d = (Data *)0x0;
  local_88[0].xp = 0.0;
  QVar16 = QWidget::mapFromGlobal(pQVar15,(QPoint *)local_88);
  pqVar31 = (qreal *)&DAT_00702c58;
  pQVar32 = local_88;
  for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
    (*(qreal (*) [3])&pQVar32->xp)[0] = *pqVar31;
    pqVar31 = pqVar31 + (ulong)bVar42 * -2 + 1;
    pQVar32 = (QPointF *)&pQVar32[-(ulong)bVar42].yp;
  }
  QTransform::fromTranslate((double)QVar16.xp.m_i.m_i,(double)QVar16.yp.m_i.m_i);
  QGraphicsView::viewportTransform(&local_178,this_01);
  QTransform::inverted((bool *)local_128);
  QTransform::operator*((QTransform *)local_88,&local_d8);
  puVar8 = puStack_190;
  if (local_188 != (undefined1 *)0x0) {
    lVar26 = (long)local_188 << 3;
    lVar33 = 0;
    do {
      local_128[0].d = *(Data **)(puVar8 + lVar33);
      bVar9 = QGesture::hasHotSpot((QGesture *)local_128[0].d);
      if (bVar9) {
        QVar44 = QGesture::hotSpot((QGesture *)local_128[0].d);
        ppQVar43 = (QGraphicsObject **)QVar44.yp;
        local_d8.m_matrix[0][0] = QVar44.xp;
        local_d8.m_matrix[0][1] = (qreal)ppQVar43;
        uVar7 = QTransform::map(local_88);
        lVar3 = *(long *)((long)local_128[0].d + 8);
        *(undefined8 *)(lVar3 + 0x90) = uVar7;
        *(QGraphicsObject ***)(lVar3 + 0x98) = ppQVar43;
      }
      else {
        lVar3 = *(long *)((long)local_128[0].d + 8);
        *(undefined8 *)(lVar3 + 0x90) = 0;
        *(undefined8 *)(lVar3 + 0x98) = 0;
      }
      pDVar4 = (this->gestureTargets).d;
      if ((pDVar4 == (Data *)0x0) ||
         (pNVar17 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                    findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)
                                        pDVar4,(QGesture **)local_128),
         pNVar17 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) {
        ppQVar43 = (QGraphicsObject **)0x0;
      }
      else {
        ppQVar43 = &pNVar17->value;
      }
      if (((ppQVar43 == (QGraphicsObject **)0x0) || (*ppQVar43 == (QGraphicsObject *)0x0)) &&
         (GVar11 = QGesture::state((QGesture *)local_128[0].d), GVar11 == GestureStarted)) {
        local_d8.m_matrix[0][0] = (qreal)local_128[0].d;
        QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGesture*,QHashDummyValue> *)&local_1a0,(QGesture **)&local_d8,
                   (QHashDummyValue *)&local_178);
      }
      lVar33 = lVar33 + 8;
    } while (lVar26 != lVar33);
  }
  if ((local_1a0.d != (Data *)0x0) && ((local_1a0.d)->size != 0)) {
    local_178.m_matrix[0][0] = 0.0;
    local_1a8.d = (Data *)0x0;
    pQVar2 = &this->cachedItemGestures;
    gestureTargetsAtHotSpots
              (this,(QSet<QGesture_*> *)&local_1a0,0,pQVar2,(QSet<QGraphicsObject_*> *)0x0,
               (QSet<QGesture_*> *)&local_178,(QSet<QGesture_*> *)&local_1a8);
    QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::keys((QList<QGraphicsObject_*> *)&local_d8,pQVar2);
    pQVar34 = &this->cachedTargetItems;
    QArrayDataPointer<QGraphicsObject_*>::operator=
              (&pQVar34->d,(QArrayDataPointer<QGraphicsObject_*> *)&local_d8);
    if ((Data *)local_d8.m_matrix[0][0] != (Data *)0x0) {
      LOCK();
      *(int *)local_d8.m_matrix[0][0] = *(int *)local_d8.m_matrix[0][0] + -1;
      UNLOCK();
      if (*(int *)local_d8.m_matrix[0][0] == 0) {
        QArrayData::deallocate((QArrayData *)local_d8.m_matrix[0][0],8,0x10);
      }
    }
    iVar18 = QList<QGraphicsObject_*>::begin(pQVar34);
    iVar19 = QList<QGraphicsObject_*>::end(pQVar34);
    if (iVar18.i != iVar19.i) {
      uVar20 = (long)iVar19.i - (long)iVar18.i >> 3;
      lVar26 = 0x3f;
      if (uVar20 != 0) {
        for (; uVar20 >> lVar26 == 0; lVar26 = lVar26 + -1) {
        }
      }
      std::
      __introsort_loop<QList<QGraphicsObject*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (iVar18,iVar19,(ulong)(((uint)lVar26 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5fa2e1);
      std::
      __final_insertion_sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (iVar18,iVar19,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5fa2e1);
    }
    if (((local_1a8.d != (Data *)0x0) && ((local_1a8.d)->size != 0)) &&
       ((this->cachedTargetItems).d.size != 0)) {
      this_02 = &this->gestureTargets;
      uVar20 = 0;
      do {
        pDVar5 = (Data *)(this->cachedTargetItems).d.ptr[uVar20];
        if (pDVar5 == (Data *)0x0) {
          piVar21 = (int *)0x0;
        }
        else {
          piVar21 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar5);
        }
        local_1b0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        if (piVar21 == (int *)0x0) {
          local_128[0].d = (Data *)(Data *)0x0;
        }
        else {
          local_128[0].d = (Data *)pDVar5;
          if (piVar21[1] == 0) {
            local_128[0].d = (Data *)0x0;
          }
        }
        QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                  ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)&local_d8,
                   (QGraphicsObject **)pQVar2);
        operator&((QSet<QGesture_*> *)&local_1b0,(QSet<QGesture_*> *)&local_1a8);
        QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_d8);
        iVar39 = 6;
        if ((local_1b0.d != (Data *)0x0) && ((local_1b0.d)->size != 0)) {
          local_d8.m_matrix[2][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[2][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[1][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[1][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[0][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[1][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_d8.m_matrix[0][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          QSet<QGesture_*>::values((QList<QGesture_*> *)local_128,(QSet<QGesture_*> *)&local_1b0);
          QGestureEvent::QGestureEvent((QGestureEvent *)&local_d8,(QList<QGesture_*> *)local_128);
          if ((Data *)local_128[0].d != (Data *)0x0) {
            LOCK();
            *(int *)&(local_128[0].d)->super_QArrayData =
                 *(int *)&(local_128[0].d)->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&(local_128[0].d)->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_128[0].d)->super_QArrayData,8,0x10);
            }
          }
          local_d8.m_matrix[0][1] = (qreal)CONCAT62(local_d8.m_matrix[0][1]._2_6_,0xca);
          pQVar15 = QGestureEvent::widget(event);
          QGestureEvent::setWidget((QGestureEvent *)&local_d8,pQVar15);
          local_d8.m_matrix[0][1]._0_5_ = (uint5)local_d8.m_matrix[0][1]._0_4_;
          if (local_1b0.d == (Data *)0x0) {
LAB_00615a46:
            QVar28.d = (Data *)0x0;
LAB_00615a48:
            uVar35 = 0;
          }
          else {
            QVar28.d = local_1b0.d;
            if ((local_1b0.d)->spans->offsets[0] != 0xff) goto LAB_00615a48;
            uVar40 = 1;
            do {
              uVar35 = uVar40;
              if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                  (_func_int **)uVar35) goto LAB_00615a46;
              uVar40 = uVar35 + 1;
            } while ((local_1b0.d)->spans[uVar35 >> 7].offsets[(uint)uVar35 & 0x7f] == 0xff);
          }
          if (uVar35 != 0 || QVar28.d != (Data *)0x0) {
            do {
              QGestureEvent::setAccepted
                        ((QGestureEvent *)&local_d8,
                         *(QGesture **)
                          (*(long *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90 + 0x80) +
                          (ulong)*(byte *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90 +
                                          (ulong)((uint)uVar35 & 0x7f)) * 8),false);
              do {
                if ((long)((QGraphicsItem *)&(QVar28.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                    uVar35) {
                  uVar35 = 0;
                  QVar28.d = (Data *)0x0;
                  break;
                }
                uVar35 = uVar35 + 1;
              } while (*(char *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90 +
                                (ulong)((uint)uVar35 & 0x7f)) == -1);
            } while ((uVar35 != 0) || (QVar28.d != (Data *)0x0));
          }
          if (piVar21 == (int *)0x0) {
            pDVar22 = (Data *)0x0;
          }
          else {
            pDVar22 = pDVar5;
            if (piVar21[1] == 0) {
              pDVar22 = (Data *)0x0;
            }
          }
          pQVar25 = (QGraphicsItem *)&pDVar22->numBuckets;
          if (pDVar22 == (Data *)0x0) {
            pQVar25 = (QGraphicsItem *)0x0;
          }
          sendEvent(this,pQVar25,(QEvent *)&local_d8);
          if (local_1b0.d == (Data *)0x0) {
LAB_00615b49:
            QVar28.d = (Data *)0x0;
LAB_00615b4c:
            uVar35 = 0;
          }
          else {
            QVar28.d = local_1b0.d;
            if ((local_1b0.d)->spans->offsets[0] != 0xff) goto LAB_00615b4c;
            uVar40 = 1;
            do {
              uVar35 = uVar40;
              if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                  (_func_int **)uVar35) goto LAB_00615b49;
              uVar40 = uVar35 + 1;
            } while ((local_1b0.d)->spans[uVar35 >> 7].offsets[(uint)uVar35 & 0x7f] == 0xff);
          }
          if (uVar35 != 0 || QVar28.d != (Data *)0x0) {
            do {
              local_1b8.d = *(Data **)(*(long *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90
                                                + 0x80) +
                                      (ulong)*(byte *)(*(long *)&(QVar28.d)->spans +
                                                       (uVar35 >> 7) * 0x90 +
                                                      (ulong)((uint)uVar35 & 0x7f)) * 8);
              if ((((local_d8.m_matrix[0][1]._4_1_ != '\0') ||
                   (bVar9 = QGestureEvent::isAccepted
                                      ((QGestureEvent *)&local_d8,(QGesture *)local_1b8.d), bVar9))
                  && (QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                                ((QHash<QGesture*,QHashDummyValue> *)&local_1a8,
                                 (QGesture **)&local_1b8), piVar21 != (int *)0x0)) &&
                 ((pDVar5 != (Data *)0x0 && (piVar21[1] != 0)))) {
                if (piVar21 == (int *)0x0) {
                  local_1c0.d = (Data *)0x0;
                }
                else {
                  local_1c0.d = pDVar5;
                  if (piVar21[1] == 0) {
                    local_1c0.d = (Data *)0x0;
                  }
                }
                local_128[0].d = (Data *)local_1b8.d;
                QHash<QGesture*,QGraphicsObject*>::emplace<QGraphicsObject*const&>
                          ((QHash<QGesture*,QGraphicsObject*> *)this_02,(QGesture **)local_128,
                           (QGraphicsObject **)&local_1c0);
                pDVar23 = pQVar2->d;
                if (pDVar23 ==
                    (Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_> *)0x0) {
LAB_00615c7a:
                  pDVar22 = (Data *)0x0;
LAB_00615c7d:
                  uVar36 = 0;
                }
                else {
                  if (1 < (uint)(pDVar23->ref).atomic._q_value.super___atomic_base<int>._M_i) {
                    pDVar23 = QHashPrivate::
                              Data<QHashPrivate::Node<QGraphicsObject_*,_QSet<QGesture_*>_>_>::
                              detached(pDVar23);
                    pQVar2->d = pDVar23;
                  }
                  pDVar22 = pQVar2->d;
                  if (pDVar22->spans->offsets[0] != 0xff) goto LAB_00615c7d;
                  uVar40 = 1;
                  do {
                    uVar36 = uVar40;
                    if (pDVar22->numBuckets == uVar36) goto LAB_00615c7a;
                    uVar40 = uVar36 + 1;
                  } while (pDVar22->spans[uVar36 >> 7].offsets[(uint)uVar36 & 0x7f] == 0xff);
                }
                if (uVar36 != 0 || pDVar22 != (Data *)0x0) {
                  do {
                    QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                              ((QHash<QGesture*,QHashDummyValue> *)
                               (pDVar22->spans[uVar36 >> 7].entries
                                [pDVar22->spans[uVar36 >> 7].offsets[(uint)uVar36 & 0x7f]].storage.
                                data + 8),(QGesture **)&local_1b8);
                    do {
                      if (pDVar22->numBuckets - 1 == uVar36) {
                        uVar36 = 0;
                        pDVar22 = (Data *)0x0;
                        break;
                      }
                      uVar36 = uVar36 + 1;
                    } while (pDVar22->spans[uVar36 >> 7].offsets[(uint)uVar36 & 0x7f] == 0xff);
                  } while ((uVar36 != 0) || (pDVar22 != (Data *)0x0));
                }
                if (piVar21 == (int *)0x0) {
                  local_1c0.d = (Data *)0x0;
                }
                else {
                  local_1c0.d = pDVar5;
                  if (piVar21[1] == 0) {
                    local_1c0.d = (Data *)0x0;
                  }
                }
                QHash<QGraphicsObject*,QSet<QGesture*>>::tryEmplace_impl<QGraphicsObject*const&>
                          ((TryEmplaceResult *)local_128,
                           (QHash<QGraphicsObject*,QSet<QGesture*>> *)pQVar2,
                           (QGraphicsObject **)&local_1c0);
                pQVar1 = (QObject *)((long)local_128[0].d + 0x20);
                local_128[0].d = (Data *)local_1b8.d;
                QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                          ((QHash<QGesture*,QHashDummyValue> *)
                           (*(long *)(*(long *)pQVar1 + ((ulong)local_128[0].ptr >> 7) * 0x90 + 0x80
                                     ) +
                           ((ulong)*(byte *)(*(long *)pQVar1 + ((ulong)local_128[0].ptr >> 7) * 0x90
                                            + (ulong)((uint)local_128[0].ptr & 0x7f)) * 2 + 1) * 8),
                           (QGesture **)local_128,(QHashDummyValue *)&local_1c8);
              }
              if (this_02->d == (Data *)0x0) {
                if (piVar21 != (int *)0x0) goto LAB_00615dcb;
              }
              else {
                pNVar17 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                          findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>
                                               *)this_02->d,(QGesture **)&local_1b8);
                if ((piVar21 != (int *)0x0) &&
                   (pNVar17 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) {
LAB_00615dcb:
                  if ((pDVar5 != (Data *)0x0) && (piVar21[1] != 0)) {
                    if (piVar21 == (int *)0x0) {
                      local_1c0.d = (Data *)0x0;
                    }
                    else {
                      local_1c0.d = pDVar5;
                      if (piVar21[1] == 0) {
                        local_1c0.d = (Data *)0x0;
                      }
                    }
                    local_128[0].d = (Data *)local_1b8.d;
                    QHash<QGesture*,QGraphicsObject*>::emplace<QGraphicsObject*const&>
                              ((QHash<QGesture*,QGraphicsObject*> *)this_02,(QGesture **)local_128,
                               (QGraphicsObject **)&local_1c0);
                  }
                }
              }
              do {
                if ((long)((QGraphicsItem *)&(QVar28.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                    uVar35) {
                  uVar35 = 0;
                  QVar28.d = (Data *)0x0;
                  break;
                }
                uVar35 = uVar35 + 1;
              } while (*(char *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90 +
                                (ulong)((uint)uVar35 & 0x7f)) == -1);
            } while ((uVar35 != 0) || (QVar28.d != (Data *)0x0));
          }
          if (local_1a8.d == (Data *)0x0) {
            iVar39 = 4;
          }
          else {
            iVar39 = (uint)((local_1a8.d)->size == 0) << 2;
          }
          QGestureEvent::~QGestureEvent((QGestureEvent *)&local_d8);
        }
        QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_1b0)
        ;
        if (piVar21 != (int *)0x0) {
          LOCK();
          *piVar21 = *piVar21 + -1;
          UNLOCK();
          if (*piVar21 == 0) {
            operator_delete(piVar21);
          }
        }
      } while (((iVar39 == 6) || (iVar39 == 0)) &&
              (uVar20 = uVar20 + 1, uVar20 < (ulong)(this->cachedTargetItems).d.size));
    }
    if (((local_178.m_matrix[0][0] != 0.0) && (*(long *)((long)local_178.m_matrix[0][0] + 8) != 0))
       && ((this->cachedTargetItems).d.size != 0)) {
      uVar20 = 0;
      do {
        if ((local_178.m_matrix[0][0] == 0.0) ||
           (*(long *)((long)local_178.m_matrix[0][0] + 8) == 0)) break;
        local_128[0].d = (Data *)(this->cachedTargetItems).d.ptr[uVar20];
        local_1b0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value(&local_1b0,(QGraphicsObject **)pQVar2);
        if (local_1b0.d == (Data *)0x0) {
LAB_00615fc4:
          QVar28.d = (Data *)0x0;
LAB_00615fc7:
          uVar35 = 0;
        }
        else {
          QVar28.d = local_1b0.d;
          if ((local_1b0.d)->spans->offsets[0] != 0xff) goto LAB_00615fc7;
          uVar40 = 1;
          do {
            uVar35 = uVar40;
            if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                (_func_int **)uVar35) goto LAB_00615fc4;
            uVar40 = uVar35 + 1;
          } while ((local_1b0.d)->spans[uVar35 >> 7].offsets[(uint)uVar35 & 0x7f] == 0xff);
        }
        if (uVar35 != 0 || QVar28.d != (Data *)0x0) {
          do {
            local_1b8.d = *(Data **)(*(long *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90 +
                                              0x80) +
                                    (ulong)*(byte *)(*(long *)&(QVar28.d)->spans +
                                                     (uVar35 >> 7) * 0x90 +
                                                    (ulong)((uint)uVar35 & 0x7f)) * 8);
            pDVar4 = (this->gestureTargets).d;
            if ((pDVar4 == (Data *)0x0) ||
               (pNVar17 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                          findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>
                                               *)pDVar4,(QGesture **)&local_1b8),
               pNVar17 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) {
              local_d8.m_matrix[0][0] = (qreal)local_1b8.d;
              QHash<QGesture*,QGraphicsObject*>::emplace<QGraphicsObject*const&>
                        ((QHash<QGesture*,QGraphicsObject*> *)&this->gestureTargets,
                         (QGesture **)&local_d8,(QGraphicsObject **)local_128);
              QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                        ((QHash<QGesture*,QHashDummyValue> *)&local_178,(QGesture **)&local_1b8);
            }
            do {
              if ((long)((QGraphicsItem *)&(QVar28.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                  uVar35) {
                uVar35 = 0;
                QVar28.d = (Data *)0x0;
                break;
              }
              uVar35 = uVar35 + 1;
            } while (*(char *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90 +
                              (ulong)((uint)uVar35 & 0x7f)) == -1);
          } while ((uVar35 != 0) || (QVar28.d != (Data *)0x0));
        }
        QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_1b0)
        ;
        uVar20 = uVar20 + 1;
      } while (uVar20 < (ulong)(this->cachedTargetItems).d.size);
    }
    QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1a8);
    QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_178);
  }
  puVar8 = puStack_190;
  local_178.m_matrix[0][0] = 0.0;
  local_1a8.d = (Data *)0x0;
  if (local_188 != (undefined1 *)0x0) {
    lVar33 = (long)local_188 << 3;
    lVar26 = 0;
    do {
      local_128[0].d = *(Data **)(puVar8 + lVar26);
      pDVar4 = (this->gestureTargets).d;
      if ((pDVar4 == (Data *)0x0) ||
         (pNVar17 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                    findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)
                                        pDVar4,(QGesture **)local_128),
         pNVar17 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) {
        ppQVar43 = (QGraphicsObject **)0x0;
      }
      else {
        ppQVar43 = &pNVar17->value;
      }
      if (ppQVar43 == (QGraphicsObject **)0x0) {
        local_1b0.d = (Data *)0x0;
      }
      else {
        local_1b0.d = (Data *)*ppQVar43;
      }
      if (local_1b0.d != (Data *)0x0) {
        QHash<QGraphicsObject*,QSet<QGesture*>>::tryEmplace_impl<QGraphicsObject*const&>
                  ((TryEmplaceResult *)&local_d8,
                   (QHash<QGraphicsObject*,QSet<QGesture*>> *)&this->cachedItemGestures,
                   (QGraphicsObject **)&local_1b0);
        pQVar1 = (QObject *)((long)local_d8.m_matrix[0][0] + 0x20);
        local_d8.m_matrix[0][0] = (qreal)local_128[0].d;
        QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGesture*,QHashDummyValue> *)
                   (*(long *)(*(long *)pQVar1 + ((ulong)local_d8.m_matrix[0][1] >> 7) * 0x90 + 0x80)
                   + ((ulong)*(byte *)(*(long *)pQVar1 +
                                       ((ulong)local_d8.m_matrix[0][1] >> 7) * 0x90 +
                                      (ulong)(SUB84(local_d8.m_matrix[0][1],0) & 0x7f)) * 2 + 1) * 8
                   ),(QGesture **)&local_d8,(QHashDummyValue *)&local_1b8);
        local_d8.m_matrix[0][0] = (qreal)local_1b0.d;
        QtPrivate::QPodArrayOps<QGraphicsObject*>::emplace<QGraphicsObject*&>
                  ((QPodArrayOps<QGraphicsObject*> *)&this->cachedTargetItems,
                   (this->cachedTargetItems).d.size,(QGraphicsObject **)&local_d8);
        QList<QGraphicsObject_*>::end(&this->cachedTargetItems);
        local_d8.m_matrix[0][0] = (qreal)local_128[0].d;
        QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGesture*,QHashDummyValue> *)&local_178,(QGesture **)&local_d8,
                   (QHashDummyValue *)&local_1b8);
        QVar6.d = ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                    *)&(local_1b0.d)->seed)->d;
        GVar12 = QGesture::gestureType((QGesture *)local_128[0].d);
        local_d8.m_matrix[0][0] = (qreal)CONCAT44(local_d8.m_matrix[0][0]._4_4_,GVar12);
        local_1b8.d = local_1b8.d & 0xffffffff00000000;
        QVar13 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::value
                           (&(QVar6.d)->gestureContext,(GestureType *)&local_d8,
                            (QFlags<Qt::GestureFlag> *)&local_1b8);
        if (((uint)QVar13.super_QFlagsStorageHelper<Qt::GestureFlag,_4>.
                   super_QFlagsStorage<Qt::GestureFlag>.i & 4) != 0) {
          local_d8.m_matrix[0][0] = (qreal)local_128[0].d;
          QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QGesture*,QHashDummyValue> *)&local_1a8,(QGesture **)&local_d8,
                     (QHashDummyValue *)&local_1b8);
        }
      }
      lVar26 = lVar26 + 8;
    } while (lVar33 != lVar26);
  }
  pQVar34 = &this->cachedTargetItems;
  iVar18 = QList<QGraphicsObject_*>::begin(pQVar34);
  iVar19 = QList<QGraphicsObject_*>::end(pQVar34);
  if (iVar18.i != iVar19.i) {
    uVar20 = (long)iVar19.i - (long)iVar18.i >> 3;
    lVar26 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> lVar26 == 0; lVar26 = lVar26 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QGraphicsObject*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
              (iVar18,iVar19,(ulong)(((uint)lVar26 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5fa2e1);
    std::
    __final_insertion_sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
              (iVar18,iVar19,
               (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x5fa2e1);
  }
  if ((this->cachedTargetItems).d.size != 0) {
    pQVar2 = &this->cachedItemGestures;
    lVar26 = 0;
    iVar39 = 0;
    do {
      pDVar5 = (Data *)(this->cachedTargetItems).d.ptr[lVar26];
      if (pDVar5 == (Data *)0x0) {
        piVar21 = (int *)0x0;
      }
      else {
        piVar21 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pDVar5);
      }
      local_1b0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      if (piVar21 == (int *)0x0) {
        local_1b8.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
        QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                  ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)local_128,
                   (QGraphicsObject **)pQVar2);
        operator&((QSet<QGesture_*> *)&local_d8,(QSet<QGesture_*> *)&local_178);
        local_1c8 = (Data *)0x0;
      }
      else {
        local_1b8.d = (Data *)pDVar5;
        if (piVar21[1] == 0) {
          local_1b8.d = (Data *)0x0;
        }
        QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                  ((QHash<QGraphicsObject_*,_QSet<QGesture_*>_> *)local_128,
                   (QGraphicsObject **)pQVar2);
        operator&((QSet<QGesture_*> *)&local_d8,(QSet<QGesture_*> *)&local_178);
        local_1c8 = pDVar5;
        if (piVar21[1] == 0) {
          local_1c8 = (Data *)0x0;
        }
      }
      QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::value
                (&local_1c0,(QGraphicsObject **)&this->cachedAlreadyDeliveredGestures);
      operator-((QSet<QGesture_*> *)&local_1b0,(QSet<QGesture_*> *)&local_d8);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_1c0);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_d8);
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)local_128);
      iVar27 = 0x17;
      if ((local_1b0.d != (Data *)0x0) && ((local_1b0.d)->size != 0)) {
        if (piVar21 == (int *)0x0) {
          local_128[0].d = (Data *)(Data *)0x0;
        }
        else {
          local_128[0].d = (Data *)pDVar5;
          if (piVar21[1] == 0) {
            local_128[0].d = (Data *)0x0;
          }
        }
        QHash<QGraphicsObject*,QSet<QGesture*>>::tryEmplace_impl<QGraphicsObject*const&>
                  ((TryEmplaceResult *)&local_d8,
                   (QHash<QGraphicsObject*,QSet<QGesture*>> *)&this->cachedAlreadyDeliveredGestures,
                   (QGraphicsObject **)local_128);
        lVar26 = *(long *)(*(long *)((long)local_d8.m_matrix[0][0] + 0x20) +
                           ((ulong)local_d8.m_matrix[0][1] >> 7) * 0x90 + 0x80);
        uVar20 = (ulong)*(byte *)(*(long *)((long)local_d8.m_matrix[0][0] + 0x20) +
                                  ((ulong)local_d8.m_matrix[0][1] >> 7) * 0x90 +
                                 (ulong)(SUB84(local_d8.m_matrix[0][1],0) & 0x7f));
        if (*(Data **)(lVar26 + (uVar20 * 2 + 1) * 8) != local_1b0.d) {
          if (local_1b0.d == (Data *)0x0) {
LAB_00616582:
            QVar28.d = (Data *)0x0;
LAB_00616585:
            uVar35 = 0;
          }
          else {
            QVar28.d = local_1b0.d;
            if ((local_1b0.d)->spans->offsets[0] != 0xff) goto LAB_00616585;
            uVar40 = 1;
            do {
              uVar35 = uVar40;
              if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                  (_func_int **)uVar35) goto LAB_00616582;
              uVar40 = uVar35 + 1;
            } while ((local_1b0.d)->spans[uVar35 >> 7].offsets[(uint)uVar35 & 0x7f] == 0xff);
          }
          if (QVar28.d != (Data *)0x0 || uVar35 != 0) {
            do {
              local_d8.m_matrix[0][0] =
                   *(qreal *)(*(long *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90 + 0x80) +
                             (ulong)*(byte *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90 +
                                             (ulong)((uint)uVar35 & 0x7f)) * 8);
              QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                        ((QHash<QGesture*,QHashDummyValue> *)(lVar26 + (uVar20 * 2 + 1) * 8),
                         (QGesture **)&local_d8,(QHashDummyValue *)&local_1b8);
              do {
                if ((long)((QGraphicsItem *)&(QVar28.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                    uVar35) {
                  uVar35 = 0;
                  QVar28.d = (Data *)0x0;
                  break;
                }
                uVar35 = uVar35 + 1;
              } while (*(char *)(*(long *)&(QVar28.d)->spans + (uVar35 >> 7) * 0x90 +
                                (ulong)((uint)uVar35 & 0x7f)) == -1);
            } while ((uVar35 != 0) || (QVar28.d != (Data *)0x0));
          }
        }
        bVar9 = QGraphicsItem::isPanel((QGraphicsItem *)&pDVar5->numBuckets);
        local_d8.m_matrix[2][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[2][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[1][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[1][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[0][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[1][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.m_matrix[0][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QSet<QGesture_*>::values((QList<QGesture_*> *)local_128,(QSet<QGesture_*> *)&local_1b0);
        QGestureEvent::QGestureEvent((QGestureEvent *)&local_d8,(QList<QGesture_*> *)local_128);
        if ((Data *)local_128[0].d != (Data *)0x0) {
          LOCK();
          *(int *)&(local_128[0].d)->super_QArrayData =
               *(int *)&(local_128[0].d)->super_QArrayData + -1;
          UNLOCK();
          if (*(int *)&(local_128[0].d)->super_QArrayData == 0) {
            QArrayData::deallocate(&(local_128[0].d)->super_QArrayData,8,0x10);
          }
        }
        pQVar15 = QGestureEvent::widget(event);
        QGestureEvent::setWidget((QGestureEvent *)&local_d8,pQVar15);
        if (piVar21 == (int *)0x0) {
          pDVar22 = (Data *)0x0;
        }
        else {
          pDVar22 = pDVar5;
          if (piVar21[1] == 0) {
            pDVar22 = (Data *)0x0;
          }
        }
        pQVar25 = (QGraphicsItem *)&pDVar22->numBuckets;
        if (pDVar22 == (Data *)0x0) {
          pQVar25 = (QGraphicsItem *)0x0;
        }
        sendEvent(this,pQVar25,(QEvent *)&local_d8);
        local_1b8.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
        if (local_1b0.d == (Data *)0x0) {
LAB_00616767:
          QVar28.d = (Data *)0x0;
LAB_00616769:
          uVar40 = 0;
        }
        else {
          QVar28.d = local_1b0.d;
          if ((local_1b0.d)->spans->offsets[0] != 0xff) goto LAB_00616769;
          uVar20 = 1;
          do {
            uVar40 = uVar20;
            if (((QGraphicsItem *)&(local_1b0.d)->numBuckets)->_vptr_QGraphicsItem ==
                (_func_int **)uVar40) goto LAB_00616767;
            uVar20 = uVar40 + 1;
          } while ((local_1b0.d)->spans[uVar40 >> 7].offsets[(uint)uVar40 & 0x7f] == 0xff);
        }
        if (QVar28.d != (Data *)0x0 || uVar40 != 0) {
          do {
            local_1c0.d = *(Data **)(*(long *)(*(long *)&(QVar28.d)->spans + (uVar40 >> 7) * 0x90 +
                                              0x80) +
                                    (ulong)*(byte *)(*(long *)&(QVar28.d)->spans +
                                                     (uVar40 >> 7) * 0x90 +
                                                    (ulong)((uint)uVar40 & 0x7f)) * 8);
            if ((local_d8.m_matrix[0][1]._4_1_ != '\0') ||
               (bVar10 = QGestureEvent::isAccepted
                                   ((QGestureEvent *)&local_d8,(QGesture *)local_1c0.d), bVar10)) {
              if ((piVar21 != (int *)0x0) &&
                 (((pDVar5 != (Data *)0x0 && (piVar21[1] != 0)) &&
                  (GVar11 = QGesture::state((QGesture *)local_1c0.d), GVar11 == GestureStarted)))) {
                if (piVar21 == (int *)0x0) {
                  pDVar22 = (Data *)0x0;
                }
                else {
                  pDVar22 = pDVar5;
                  if (piVar21[1] == 0) {
                    pDVar22 = (Data *)0x0;
                  }
                }
                QHash<QGesture*,QGraphicsObject*>::tryEmplace_impl<QGesture*const&>
                          ((TryEmplaceResult *)local_128,
                           (QHash<QGesture*,QGraphicsObject*> *)&this->gestureTargets,
                           (QGesture **)&local_1c0);
                *(Data **)(*(long *)(*(long *)((long)local_128[0].d + 0x20) +
                                     ((ulong)local_128[0].ptr >> 7) * 0x90 + 0x80) +
                          ((ulong)*(byte *)(*(long *)((long)local_128[0].d + 0x20) +
                                            ((ulong)local_128[0].ptr >> 7) * 0x90 +
                                           (ulong)((uint)local_128[0].ptr & 0x7f)) * 2 + 1) * 8) =
                     pDVar22;
              }
              QHash<QGesture*,QHashDummyValue>::removeImpl<QGesture*>
                        ((QHash<QGesture*,QHashDummyValue> *)&local_178,(QGesture **)&local_1c0);
            }
            else if (((piVar21 != (int *)0x0) && (pDVar5 != (Data *)0x0)) && (piVar21[1] != 0)) {
              if (piVar21 == (int *)0x0) {
                pDVar22 = (Data *)0x0;
              }
              else {
                pDVar22 = pDVar5;
                if (piVar21[1] == 0) {
                  pDVar22 = (Data *)0x0;
                }
              }
              pDVar4 = (this->gestureTargets).d;
              if ((pDVar4 == (Data *)0x0) ||
                 (pNVar17 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                            findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>
                                                 *)pDVar4,(QGesture **)&local_1c0),
                 pNVar17 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) {
                ppQVar43 = (QGraphicsObject **)0x0;
              }
              else {
                ppQVar43 = &pNVar17->value;
              }
              if (ppQVar43 == (QGraphicsObject **)0x0) {
                pDVar41 = (Data *)0x0;
              }
              else {
                pDVar41 = (Data *)*ppQVar43;
              }
              if (pDVar22 == pDVar41) {
                local_128[0].d = (Data *)local_1c0.d;
                QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                          ((QHash<QGesture*,QHashDummyValue> *)&local_1b8,(QGesture **)local_128,
                           (QHashDummyValue *)&local_1c8);
              }
            }
            do {
              if ((long)((QGraphicsItem *)&(QVar28.d)->numBuckets)->_vptr_QGraphicsItem - 1U ==
                  uVar40) {
                QVar28.d = (Data *)0x0;
                uVar40 = 0;
                break;
              }
              uVar40 = uVar40 + 1;
            } while (*(char *)(*(long *)&(QVar28.d)->spans + (uVar40 >> 7) * 0x90 +
                              (ulong)((uint)uVar40 & 0x7f)) == -1);
          } while ((QVar28.d != (Data *)0x0) || (uVar40 != 0));
        }
        iVar27 = 0x15;
        if ((local_178.m_matrix[0][0] != 0.0) &&
           (*(long *)((long)local_178.m_matrix[0][0] + 8) != 0)) {
          if (local_1b8.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) {
            bVar10 = true;
          }
          else {
            bVar10 = (local_1b8.d)->size == 0;
          }
          iVar27 = 0;
          if (!bVar9 && !bVar10) {
            ppQVar43 = (this->cachedTargetItems).d.ptr;
            lVar26 = (this->cachedTargetItems).d.size;
            local_1c0.d = (Data *)0x0;
            QHash<QGraphicsObject_*,_QHashDummyValue>::reserve
                      ((QHash<QGraphicsObject_*,_QHashDummyValue> *)&local_1c0,lVar26);
            if (lVar26 != 0) {
              lVar33 = 0;
              do {
                local_128[0].d = *(Data **)((long)ppQVar43 + lVar33);
                QHash<QGraphicsObject*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                          ((QHash<QGraphicsObject*,QHashDummyValue> *)&local_1c0,
                           (QGraphicsObject **)local_128,(QHashDummyValue *)&local_1c8);
                lVar33 = lVar33 + 8;
              } while (lVar26 << 3 != lVar33);
            }
            if (((piVar21 != (int *)0x0) && (pDVar5 != (Data *)0x0)) && (piVar21[1] != 0)) {
              if (local_1b8.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) {
LAB_00616ad9:
                QVar29.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
LAB_00616adb:
                sVar37 = 0;
              }
              else {
                if (1 < (uint)((local_1b8.d)->ref).atomic._q_value.super___atomic_base<int>._M_i) {
                  local_1b8.d = QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>
                                ::detached(local_1b8.d);
                }
                QVar29.d = local_1b8.d;
                if ((local_1b8.d)->spans->offsets[0] != 0xff) goto LAB_00616adb;
                uVar20 = 1;
                do {
                  sVar37 = uVar20;
                  if ((local_1b8.d)->numBuckets == sVar37) goto LAB_00616ad9;
                  uVar20 = sVar37 + 1;
                } while ((local_1b8.d)->spans[sVar37 >> 7].offsets[(uint)sVar37 & 0x7f] == 0xff);
              }
              it.bucket = sVar37;
              it.d = QVar29.d;
              if (QVar29.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 ||
                  sVar37 != 0) {
                do {
                  uVar20 = it.bucket;
                  pDVar30 = it.d;
                  if (local_1a8.d == (Data *)0x0) {
LAB_00616b73:
                    do {
                      if (pDVar30->numBuckets - 1 == uVar20) {
                        it = (piter)ZEXT816(0);
                        break;
                      }
                      uVar20 = uVar20 + 1;
                      it.bucket = uVar20;
                      it.d = pDVar30;
                    } while (pDVar30->spans[uVar20 >> 7].offsets[(uint)uVar20 & 0x7f] == 0xff);
                  }
                  else {
                    uVar40 = uVar20 >> 7;
                    uVar38 = (uint)it.bucket & 0x7f;
                    pNVar24 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QHashDummyValue>>::
                              findNode<QGesture*>((
                                                  Data<QHashPrivate::Node<QGesture*,QHashDummyValue>>
                                                  *)local_1a8.d,
                                                  (QGesture **)
                                                  (pDVar30->spans[uVar40].entries +
                                                  pDVar30->spans[uVar40].offsets[uVar38]));
                    if (pNVar24 == (Node<QGesture_*,_QHashDummyValue> *)0x0) goto LAB_00616b73;
                    pDVar22 = *(Data **)pDVar30->spans[uVar40].entries
                                        [pDVar30->spans[uVar40].offsets[uVar38]].storage.data;
                    local_1cc = QGesture::gestureType((QGesture *)pDVar22);
                    if (piVar21 == (int *)0x0) {
                      pDVar41 = (Data *)0x0;
                    }
                    else {
                      pDVar41 = pDVar5;
                      if (piVar21[1] == 0) {
                        pDVar41 = (Data *)0x0;
                      }
                    }
                    if (pDVar41 != (Data *)0x0) {
                      pQVar25 = (QGraphicsItem *)&pDVar41->numBuckets;
                      do {
                        local_1c8 = (Data *)QGraphicsItem::toGraphicsObject(pQVar25);
                        if ((local_1c8 != (Data *)0x0) &&
                           (bVar9 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::contains
                                              (&((pQVar25->d_ptr).d)->gestureContext,&local_1cc),
                           bVar9)) {
                          local_128[0].d = (Data *)local_1c8;
                          QHash<QGraphicsObject*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                                    ((QHash<QGraphicsObject*,QHashDummyValue> *)&local_1c0,
                                     (QGraphicsObject **)local_128,&local_179);
                          QHash<QGraphicsObject*,QSet<QGesture*>>::
                          tryEmplace_impl<QGraphicsObject*const&>
                                    ((TryEmplaceResult *)local_128,
                                     (QHash<QGraphicsObject*,QSet<QGesture*>> *)pQVar2,
                                     (QGraphicsObject **)&local_1c8);
                          pQVar1 = (QObject *)((long)local_128[0].d + 0x20);
                          lVar26 = ((ulong)local_128[0].ptr >> 7) * 0x90;
                          local_128[0].d = (Data *)pDVar22;
                          QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                                    ((QHash<QGesture*,QHashDummyValue> *)
                                     (*(long *)(*(long *)pQVar1 + 0x80 + lVar26) +
                                      (ulong)*(byte *)((ulong)((uint)local_128[0].ptr & 0x7f) +
                                                      *(long *)pQVar1 + lVar26) * 0x10 + 8),
                                     (QGesture **)local_128,&local_179);
                        }
                        bVar9 = QGraphicsItem::isPanel(pQVar25);
                      } while ((!bVar9) &&
                              (pQVar25 = QGraphicsItem::parentItem(pQVar25),
                              pQVar25 != (QGraphicsItem *)0x0));
                    }
                    it = (piter)QHash<QGesture_*,_QHashDummyValue>::erase
                                          (&local_1b8,(const_iterator)it);
                  }
                } while ((it.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) ||
                        (it.bucket != 0));
              }
            }
            gestureTargetsAtHotSpots
                      (this,(QSet<QGesture_*> *)&local_1b8,ReceivePartialGestures,pQVar2,
                       (QSet<QGraphicsObject_*> *)&local_1c0,(QSet<QGesture_*> *)0x0,
                       (QSet<QGesture_*> *)0x0);
            QSet<QGraphicsObject_*>::values
                      ((QList<QGraphicsObject_*> *)local_128,(QSet<QGraphicsObject_*> *)&local_1c0);
            QArrayDataPointer<QGraphicsObject_*>::operator=(&pQVar34->d,local_128);
            if ((Data *)local_128[0].d != (Data *)0x0) {
              LOCK();
              *(int *)&(local_128[0].d)->super_QArrayData =
                   *(int *)&(local_128[0].d)->super_QArrayData + -1;
              UNLOCK();
              if (*(int *)&(local_128[0].d)->super_QArrayData == 0) {
                QArrayData::deallocate(&(local_128[0].d)->super_QArrayData,8,0x10);
              }
            }
            iVar18 = QList<QGraphicsObject_*>::begin(pQVar34);
            iVar19 = QList<QGraphicsObject_*>::end(pQVar34);
            if (iVar18.i != iVar19.i) {
              uVar20 = (long)iVar19.i - (long)iVar18.i >> 3;
              lVar26 = 0x3f;
              if (uVar20 != 0) {
                for (; uVar20 >> lVar26 == 0; lVar26 = lVar26 + -1) {
                }
              }
              std::
              __introsort_loop<QList<QGraphicsObject*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                        (iVar18,iVar19,(ulong)(((uint)lVar26 ^ 0x3f) * 2) ^ 0x7e,
                         (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                         0x5fa2e1);
              std::
              __final_insertion_sort<QList<QGraphicsObject*>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                        (iVar18,iVar19,
                         (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)
                         0x5fa2e1);
            }
            QHash<QGraphicsObject_*,_QHashDummyValue>::~QHash
                      ((QHash<QGraphicsObject_*,_QHashDummyValue> *)&local_1c0);
            iVar27 = 0x17;
            iVar39 = -1;
          }
        }
        QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1b8);
        QGestureEvent::~QGestureEvent((QGestureEvent *)&local_d8);
      }
      QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_1b0);
      if (piVar21 != (int *)0x0) {
        LOCK();
        *piVar21 = *piVar21 + -1;
        UNLOCK();
        if (*piVar21 == 0) {
          operator_delete(piVar21);
        }
      }
      if ((iVar27 != 0x17) && (iVar27 != 0)) break;
      iVar39 = iVar39 + 1;
      lVar26 = (long)iVar39;
    } while (lVar26 < (this->cachedTargetItems).d.size);
  }
  if (local_1a0.d == (Data *)0x0) {
    QVar29.d = (Data *)0x0;
LAB_00616e65:
    uVar20 = 0;
  }
  else {
    QVar29.d = local_1a0.d;
    if ((local_1a0.d)->spans->offsets[0] != 0xff) goto LAB_00616e65;
    uVar40 = 1;
    do {
      uVar20 = uVar40;
      if ((local_1a0.d)->numBuckets == uVar20) {
        QVar29.d = (Data *)0x0;
        uVar20 = 0;
        break;
      }
      uVar40 = uVar20 + 1;
    } while ((local_1a0.d)->spans[uVar20 >> 7].offsets[(uint)uVar20 & 0x7f] == 0xff);
  }
  if (QVar29.d != (Data *)0x0 || uVar20 != 0) {
    do {
      this_00 = *(QGesture **)
                 (QVar29.d)->spans[uVar20 >> 7].entries
                 [(QVar29.d)->spans[uVar20 >> 7].offsets[(uint)uVar20 & 0x7f]].storage.data;
      GVar14 = QGesture::gestureCancelPolicy(this_00);
      if (GVar14 == CancelAllInContext) {
        cancelGesturesForChildren(this,this_00);
      }
      do {
        if ((QVar29.d)->numBuckets - 1 == uVar20) {
          QVar29.d = (Data *)0x0;
          uVar20 = 0;
          break;
        }
        uVar20 = uVar20 + 1;
      } while ((QVar29.d)->spans[uVar20 >> 7].offsets[(uint)uVar20 & 0x7f] == 0xff);
    } while ((QVar29.d != (Data *)0x0) || (uVar20 != 0));
  }
  puVar8 = puStack_190;
  if (local_188 != (undefined1 *)0x0) {
    lVar33 = (long)local_188 << 3;
    lVar26 = 0;
    do {
      local_d8.m_matrix[0][0] = *(qreal *)(puVar8 + lVar26);
      GVar11 = QGesture::state((QGesture *)local_d8.m_matrix[0][0]);
      if (GVar11 - GestureFinished < 2) {
        QHash<QGesture*,QGraphicsObject*>::removeImpl<QGesture*>
                  ((QHash<QGesture*,QGraphicsObject*> *)&this->gestureTargets,(QGesture **)&local_d8
                  );
      }
      lVar26 = lVar26 + 8;
    } while (lVar33 != lVar26);
  }
  QList<QGraphicsObject_*>::clear(pQVar34);
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::clear(&this->cachedItemGestures);
  QHash<QGraphicsObject_*,_QSet<QGesture_*>_>::clear(&this->cachedAlreadyDeliveredGestures);
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1a8);
  QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)&local_178);
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_1a0);
  if (local_198 != (QArrayData *)0x0) {
    LOCK();
    (local_198->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_198->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_198->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_198,8,0x10);
    }
  }
LAB_00616fda:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::gestureEventHandler(QGestureEvent *event)
{
    QWidget *viewport = event->widget();
    if (!viewport)
        return;
    QGraphicsView *graphicsView = qobject_cast<QGraphicsView *>(viewport->parent());
    if (!graphicsView)
        return;

    const QList<QGesture *> allGestures = event->gestures();
    DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
            << "Gestures:" <<  allGestures;

    QSet<QGesture *> startedGestures;
    QPoint delta = viewport->mapFromGlobal(QPoint());
    QTransform toScene = QTransform::fromTranslate(delta.x(), delta.y())
                         * graphicsView->viewportTransform().inverted();
    for (QGesture *gesture : allGestures) {
        // cache scene coordinates of the hot spot
        if (gesture->hasHotSpot()) {
            gesture->d_func()->sceneHotSpot = toScene.map(gesture->hotSpot());
        } else {
            gesture->d_func()->sceneHotSpot = QPointF();
        }

        QGraphicsObject *target = gestureTargets.value(gesture, 0);
        if (!target) {
            // when we are not in started mode but don't have a target
            // then the only one interested in gesture is the view/scene
            if (gesture->state() == Qt::GestureStarted)
                startedGestures.insert(gesture);
        }
    }

    if (!startedGestures.isEmpty()) {
        QSet<QGesture *> normalGestures; // that have just one target
        QSet<QGesture *> conflictedGestures; // that have multiple possible targets
        gestureTargetsAtHotSpots(startedGestures, Qt::GestureFlag(0), &cachedItemGestures, nullptr,
                                 &normalGestures, &conflictedGestures);
        cachedTargetItems = cachedItemGestures.keys();
        std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                << "Normal gestures:" << normalGestures
                << "Conflicting gestures:" << conflictedGestures;

        // deliver conflicted gestures as override events AND remember
        // initial gesture targets
        if (!conflictedGestures.isEmpty()) {
            for (int i = 0; i < cachedTargetItems.size(); ++i) {
                QPointer<QGraphicsObject> item = cachedTargetItems.at(i);

                // get gestures to deliver to the current item
                const QSet<QGesture *> gestures = conflictedGestures & cachedItemGestures.value(item.data());
                if (gestures.isEmpty())
                    continue;

                DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                        << "delivering override to"
                        << item.data() << gestures;
                // send gesture override
                QGestureEvent ev(gestures.values());
                ev.t = QEvent::GestureOverride;
                ev.setWidget(event->widget());
                // mark event and individual gestures as ignored
                ev.ignore();
                for (QGesture *g : gestures)
                    ev.setAccepted(g, false);
                sendEvent(item.data(), &ev);
                // mark all accepted gestures to deliver them as normal gesture events
                for (QGesture *g : gestures) {
                    if (ev.isAccepted() || ev.isAccepted(g)) {
                        conflictedGestures.remove(g);
                        // mark the item as a gesture target
                        if (item) {
                            gestureTargets.insert(g, item.data());
                            QHash<QGraphicsObject *, QSet<QGesture *> >::iterator it, e;
                            it = cachedItemGestures.begin();
                            e = cachedItemGestures.end();
                            for(; it != e; ++it)
                                it.value().remove(g);
                            cachedItemGestures[item.data()].insert(g);
                        }
                        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                                << "override was accepted:"
                                << g << item.data();
                    }
                    // remember the first item that received the override event
                    // as it most likely become a target if no one else accepts
                    // the override event
                    if (!gestureTargets.contains(g) && item)
                        gestureTargets.insert(g, item.data());

                }
                if (conflictedGestures.isEmpty())
                    break;
            }
        }
        // remember the initial target item for each gesture that was not in
        // the conflicted state.
        if (!normalGestures.isEmpty()) {
            for (int i = 0; i < cachedTargetItems.size() && !normalGestures.isEmpty(); ++i) {
                QGraphicsObject *item = cachedTargetItems.at(i);

                // get gestures to deliver to the current item
                const auto gestures = cachedItemGestures.value(item);
                for (QGesture *g : gestures) {
                    if (!gestureTargets.contains(g)) {
                        gestureTargets.insert(g, item);
                        normalGestures.remove(g);
                    }
                }
            }
        }
    }


    // deliver all gesture events
    QSet<QGesture *> undeliveredGestures;
    QSet<QGesture *> parentPropagatedGestures;
    for (QGesture *gesture : allGestures) {
        if (QGraphicsObject *target = gestureTargets.value(gesture, 0)) {
            cachedItemGestures[target].insert(gesture);
            cachedTargetItems.append(target);
            undeliveredGestures.insert(gesture);
            QGraphicsItemPrivate *d = target->QGraphicsItem::d_func();
            const Qt::GestureFlags flags = d->gestureContext.value(gesture->gestureType());
            if (flags & Qt::IgnoredGesturesPropagateToParent)
                parentPropagatedGestures.insert(gesture);
        } else {
            DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                    << "no target for" << gesture << "at"
                    << gesture->hotSpot() << gesture->d_func()->sceneHotSpot;
        }
    }
    std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
    for (int i = 0; i < cachedTargetItems.size(); ++i) {
        QPointer<QGraphicsObject> receiver = cachedTargetItems.at(i);
        const QSet<QGesture *> gestures = (undeliveredGestures
                                        & cachedItemGestures.value(receiver.data()))
                                        - cachedAlreadyDeliveredGestures.value(receiver.data());

        if (gestures.isEmpty())
            continue;

        cachedAlreadyDeliveredGestures[receiver.data()] += gestures;
        const bool isPanel = receiver.data()->isPanel();

        DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                << "delivering to"
                << receiver.data() << gestures;
        QGestureEvent ev(gestures.values());
        ev.setWidget(event->widget());
        sendEvent(receiver.data(), &ev);
        QSet<QGesture *> ignoredGestures;
        for (QGesture *g : gestures) {
            if (!ev.isAccepted() && !ev.isAccepted(g)) {
                // if the gesture was ignored by its target, we will update the
                // targetItems list with a possible target items (items that
                // want to receive partial gestures).
                // ### won't work if the target was destroyed in the event
                //     we will just stop delivering it.
                if (receiver && receiver.data() == gestureTargets.value(g, 0))
                    ignoredGestures.insert(g);
            } else {
                if (receiver && g->state() == Qt::GestureStarted) {
                    // someone accepted the propagated initial GestureStarted
                    // event, let it be the new target for all following events.
                    gestureTargets[g] = receiver.data();
                }
                undeliveredGestures.remove(g);
            }
        }
        if (undeliveredGestures.isEmpty())
            break;

        // ignoredGestures list is only filled when delivering to the gesture
        // target item, so it is safe to assume item == target.
        if (!ignoredGestures.isEmpty() && !isPanel) {
            // look for new potential targets for gestures that were ignored
            // and should be propagated.

            QSet<QGraphicsObject *> targetsSet(cachedTargetItems.constBegin(), cachedTargetItems.constEnd());

            if (receiver) {
                // first if the gesture should be propagated to parents only
                for (QSet<QGesture *>::iterator it = ignoredGestures.begin();
                     it != ignoredGestures.end();) {
                    if (parentPropagatedGestures.contains(*it)) {
                        QGesture *gesture = *it;
                        const Qt::GestureType gestureType = gesture->gestureType();
                        QGraphicsItem *item = receiver.data();
                        while (item) {
                            if (QGraphicsObject *obj = item->toGraphicsObject()) {
                                if (item->d_func()->gestureContext.contains(gestureType)) {
                                    targetsSet.insert(obj);
                                    cachedItemGestures[obj].insert(gesture);
                                }
                            }
                            if (item->isPanel())
                                break;
                            item = item->parentItem();
                        }

                        it = ignoredGestures.erase(it);
                        continue;
                    }
                    ++it;
                }
            }

            gestureTargetsAtHotSpots(ignoredGestures, Qt::ReceivePartialGestures,
                                     &cachedItemGestures, &targetsSet, nullptr, nullptr);

            cachedTargetItems = targetsSet.values();
            std::sort(cachedTargetItems.begin(), cachedTargetItems.end(), qt_closestItemFirst);
            DEBUG() << "QGraphicsScenePrivate::gestureEventHandler:"
                    << "new targets:" << cachedTargetItems;
            i = -1; // start delivery again
            continue;
        }
    }

    for (QGesture *g : std::as_const(startedGestures)) {
        if (g->gestureCancelPolicy() == QGesture::CancelAllInContext) {
            DEBUG() << "lets try to cancel some";
            // find gestures in context in Qt::GestureStarted or Qt::GestureUpdated state and cancel them
            cancelGesturesForChildren(g);
        }
    }

    // forget about targets for gestures that have ended
    for (QGesture *g : allGestures) {
        switch (g->state()) {
        case Qt::GestureFinished:
        case Qt::GestureCanceled:
            gestureTargets.remove(g);
            break;
        default:
            break;
        }
    }

    cachedTargetItems.clear();
    cachedItemGestures.clear();
    cachedAlreadyDeliveredGestures.clear();
}